

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  uint uVar2;
  byte *pbVar3;
  char *pcVar4;
  int tok;
  int t_1;
  int open;
  int t;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  end_local = ptr;
  ptr_local = (char *)enc;
LAB_0065b568:
  do {
    if ((long)end - (long)end_local < 1) {
      return -1;
    }
    switch(ptr_local[(ulong)(byte)*end_local + 0x80]) {
    case '\x05':
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      iVar1 = (**(code **)(ptr_local + 0x180))(ptr_local,end_local);
      if (iVar1 == 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 2;
      break;
    case '\x06':
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      iVar1 = (**(code **)(ptr_local + 0x188))(ptr_local,end_local);
      if (iVar1 == 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 3;
      break;
    case '\a':
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      iVar1 = (**(code **)(ptr_local + 400))(ptr_local,end_local);
      if (iVar1 == 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 4;
      break;
    default:
      *nextTokPtr = end_local;
      return 0;
    case '\t':
    case '\n':
    case '\x15':
      while( true ) {
        end_local = end_local + 1;
        if ((long)end - (long)end_local < 1) {
          return -1;
        }
        uVar2 = (uint)(byte)ptr_local[(ulong)(byte)*end_local + 0x80];
        if (uVar2 == 0xe) break;
        if ((1 < uVar2 - 9) && (uVar2 != 0x15)) {
          *nextTokPtr = end_local;
          return 0;
        }
      }
    case '\x0e':
      while( true ) {
        pbVar3 = (byte *)(end_local + 1);
        if ((long)end - (long)pbVar3 < 1) {
          return -1;
        }
        uVar2 = (uint)(byte)ptr_local[(ulong)*pbVar3 + 0x80];
        if ((uVar2 == 0xc) || (uVar2 == 0xd)) break;
        end_local = (char *)pbVar3;
        if ((1 < uVar2 - 9) && (uVar2 != 0x15)) {
          *nextTokPtr = (char *)pbVar3;
          return 0;
        }
      }
      end_local = end_local + 2;
      while( true ) {
        if ((long)end - (long)end_local < 1) {
          return -1;
        }
        if ((byte)ptr_local[(ulong)(byte)*end_local + 0x80] == uVar2) break;
        switch((uint)(byte)ptr_local[(ulong)(byte)*end_local + 0x80]) {
        case 0:
        case 1:
        case 8:
          *nextTokPtr = end_local;
          return 0;
        case 2:
          *nextTokPtr = end_local;
          return 0;
        case 3:
          iVar1 = normal_scanRef((ENCODING *)ptr_local,end_local + 1,end,&end_local);
          if (iVar1 < 1) {
            if (iVar1 != 0) {
              return iVar1;
            }
            *nextTokPtr = end_local;
            return 0;
          }
          break;
        default:
          end_local = end_local + 1;
          break;
        case 5:
          if ((long)end - (long)end_local < 2) {
            return -2;
          }
          iVar1 = (**(code **)(ptr_local + 0x1b0))(ptr_local,end_local);
          if (iVar1 != 0) {
            *nextTokPtr = end_local;
            return 0;
          }
          end_local = end_local + 2;
          break;
        case 6:
          if ((long)end - (long)end_local < 3) {
            return -2;
          }
          iVar1 = (**(code **)(ptr_local + 0x1b8))(ptr_local,end_local);
          if (iVar1 != 0) {
            *nextTokPtr = end_local;
            return 0;
          }
          end_local = end_local + 3;
          break;
        case 7:
          if ((long)end - (long)end_local < 4) {
            return -2;
          }
          iVar1 = (**(code **)(ptr_local + 0x1c0))(ptr_local,end_local);
          if (iVar1 != 0) {
            *nextTokPtr = end_local;
            return 0;
          }
          end_local = end_local + 4;
        }
      }
      end_local = end_local + 1;
      if ((long)end - (long)end_local < 1) {
        return -1;
      }
      switch(ptr_local[(ulong)(byte)*end_local + 0x80]) {
      case '\t':
      case '\n':
      case '\x15':
        break;
      case '\v':
LAB_0065bc3d:
        *nextTokPtr = end_local + 1;
        return 1;
      default:
        *nextTokPtr = end_local;
        return 0;
      case '\x11':
LAB_0065bc5a:
        pcVar4 = end_local + 1;
        if ((long)end - (long)pcVar4 < 1) {
          return -1;
        }
        if (*pcVar4 != '>') {
          *nextTokPtr = pcVar4;
          return 0;
        }
        *nextTokPtr = end_local + 2;
        return 3;
      }
      do {
        pbVar3 = (byte *)(end_local + 1);
        if ((long)end - (long)pbVar3 < 1) {
          return -1;
        }
        switch(ptr_local[(ulong)*pbVar3 + 0x80]) {
        case '\x05':
          goto switchD_0065baef_caseD_5;
        case '\x06':
          if ((long)end - (long)pbVar3 < 3) {
            return -2;
          }
          end_local = (char *)pbVar3;
          iVar1 = (**(code **)(ptr_local + 0x1a0))(ptr_local,pbVar3);
          if (iVar1 == 0) {
            *nextTokPtr = end_local;
            return 0;
          }
          end_local = end_local + 3;
          goto LAB_0065b568;
        case '\a':
          if ((long)end - (long)pbVar3 < 4) {
            return -2;
          }
          end_local = (char *)pbVar3;
          iVar1 = (**(code **)(ptr_local + 0x1a8))(ptr_local,pbVar3);
          if (iVar1 == 0) {
            *nextTokPtr = end_local;
            return 0;
          }
          end_local = end_local + 4;
          goto LAB_0065b568;
        default:
          *nextTokPtr = (char *)pbVar3;
          return 0;
        case '\t':
        case '\n':
        case '\x15':
          end_local = (char *)pbVar3;
          break;
        case '\v':
          end_local = (char *)pbVar3;
          goto LAB_0065bc3d;
        case '\x11':
          end_local = (char *)pbVar3;
          goto LAB_0065bc5a;
        case '\x16':
        case '\x18':
          end_local = end_local + 2;
          goto LAB_0065b568;
        case '\x1d':
          *nextTokPtr = (char *)pbVar3;
          return 0;
        }
      } while( true );
    case '\x16':
    case '\x18':
    case '\x19':
    case '\x1a':
    case '\x1b':
      end_local = end_local + 1;
      break;
    case '\x1d':
      *nextTokPtr = end_local;
      return 0;
    }
  } while( true );
switchD_0065baef_caseD_5:
  if ((long)end - (long)pbVar3 < 2) {
    return -2;
  }
  end_local = (char *)pbVar3;
  iVar1 = (**(code **)(ptr_local + 0x198))(ptr_local,pbVar3);
  if (iVar1 == 0) {
    *nextTokPtr = end_local;
    return 0;
  }
  end_local = end_local + 2;
  goto LAB_0065b568;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          REQUIRE_CHAR(enc, ptr, end);
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            REQUIRE_CHAR(enc, ptr, end);
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}